

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O2

void __thiscall
S2RegionCoverer::AdjustCellLevels
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *cells)

{
  pointer pSVar1;
  long lVar2;
  bool bVar3;
  int level;
  int level_00;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  ulong uVar4;
  pointer pSVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  S2CellId id;
  ostream *local_48;
  
  bVar3 = std::
          is_sorted<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>>
                    ((cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (!bVar3) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&id,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_48,"Check failed: is_sorted(cells->begin(), cells->end()) ");
    abort();
  }
  if ((this->options_).level_mod_ != 1) {
    pSVar1 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = 0;
    for (pSVar5 = (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
                  super__Vector_impl_data._M_start; uVar6 = (uint)uVar4, pSVar5 != pSVar1;
        pSVar5 = pSVar5 + 1) {
      id.id_ = pSVar5->id_;
      level = S2CellId::level(&id);
      level_00 = AdjustLevel(this,level);
      if (level_00 != level) {
        id = S2CellId::parent(&id,level_00);
      }
      if (((int)uVar6 < 1) ||
         (bVar3 = S2CellId::contains((cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>
                                     )._M_impl.super__Vector_impl_data._M_start + (uVar4 - 1),id),
         !bVar3)) {
        uVar7 = uVar6 + 1;
        do {
          uVar8 = (int)uVar6 >> 0x1f & uVar6;
          if ((int)uVar4 < 1) break;
          lVar2 = uVar4 - 1;
          uVar4 = uVar4 - 1;
          bVar3 = S2CellId::contains(&id,(S2CellId)
                                         (cells->
                                         super__Vector_base<S2CellId,_std::allocator<S2CellId>_>).
                                         _M_impl.super__Vector_impl_data._M_start[lVar2].id_);
          uVar7 = uVar7 - 1;
          uVar8 = uVar7;
        } while (bVar3);
        uVar4 = (ulong)(uVar8 + 1);
        (cells->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_start[(int)uVar8].id_ = id.id_;
      }
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::resize(cells,(long)(int)uVar6);
  }
  return;
}

Assistant:

void S2RegionCoverer::AdjustCellLevels(vector<S2CellId>* cells) const {
  S2_DCHECK(is_sorted(cells->begin(), cells->end()));
  if (options_.level_mod() == 1) return;

  int out = 0;
  for (S2CellId id : *cells) {
    int level = id.level();
    int new_level = AdjustLevel(level);
    if (new_level != level) id = id.parent(new_level);
    if (out > 0 && (*cells)[out-1].contains(id)) continue;
    while (out > 0 && id.contains((*cells)[out-1])) --out;
    (*cells)[out++] = id;
  }
  cells->resize(out);
}